

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

bool __thiscall
CUI::DoEditBox(CUI *this,CLineInput *pLineInput,CUIRect *pRect,float FontSize,int Corners,
              IButtonColorFunction *pColorFunction)

{
  bool bVar1;
  CLineInput *pCVar2;
  ITextRender *pIVar3;
  bool bVar4;
  uint uVar5;
  int End;
  uint uVar6;
  char *str;
  byte bVar7;
  int iVar8;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  anon_union_4_2_94730017_for_vector4_base<float>_7 extraout_XMM0_Db;
  anon_union_4_2_94730017_for_vector4_base<float>_7 extraout_XMM0_Db_00;
  anon_union_4_2_94730039_for_vector4_base<float>_5 in_XMM1_Da;
  float fVar9;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar10;
  anon_union_4_2_94730017_for_vector4_base<float>_7 in_XMM1_Db;
  float fVar11;
  anon_union_4_2_94730039_for_vector4_base<float>_5 aVar12;
  CUIRect Textbox;
  uint local_90;
  vec4 local_58;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_48;
  float local_44;
  anon_union_4_2_94730039_for_vector4_base<float>_5 local_40;
  float local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (pLineInput->m_TextCursor).m_FontSize = FontSize;
  (pLineInput->m_TextCursor).m_Align = 4;
  bVar4 = MouseHovered(this,pRect);
  pCVar2 = (CLineInput *)this->m_pLastActiveItem;
  bVar1 = pLineInput->m_WasChanged;
  pLineInput->m_WasChanged = false;
  str = CLineInput::GetDisplayedString(pLineInput);
  aVar12 = (anon_union_4_2_94730039_for_vector4_base<float>_5)pLineInput->m_ScrollOffset;
  CUIRect::VMargin(pRect,2.0,(CUIRect *)&local_48);
  if (pCVar2 != pLineInput) {
    bVar7 = 0;
    goto LAB_0018b363;
  }
  local_90 = pLineInput->m_CursorPos;
  if (((bVar4) && ((this->m_MouseButtons & 1) != 0)) && (bVar1 == false)) {
    DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll = '\x01'
    ;
    in_XMM1_Da = (anon_union_4_2_94730039_for_vector4_base<float>_5)this->m_MouseX;
    in_XMM1_Db.w = 0.0;
    iVar8 = 0;
    DoEditBox::s_ScrollStartX = (float)in_XMM1_Da;
    if (0 < pLineInput->m_NumChars) {
      fVar9 = in_XMM1_Da.z - local_48.z;
      fVar11 = 0.0;
      uVar6 = 0;
      do {
        uVar5 = str_utf8_forward(str,uVar6);
        (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                  (FontSize,this->m_pTextRender,str,(ulong)uVar5);
        in_XMM1_Da.z = ((extraout_XMM0_Da - fVar11) * 0.5 + fVar11) - aVar12.z;
        in_XMM1_Db = extraout_XMM0_Db;
        if (fVar9 < in_XMM1_Da.z) {
          if (DoEditBox::s_SelectionStartOffset < 0) {
            bVar7 = 0;
            DoEditBox::s_SelectionStartOffset = uVar6;
            goto LAB_0018b30a;
          }
          bVar7 = 0;
          goto LAB_0018b312;
        }
        iVar8 = iVar8 + 1;
        if ((iVar8 == pLineInput->m_NumChars) &&
           (local_90 = pLineInput->m_Len, DoEditBox::s_SelectionStartOffset < 0)) {
          DoEditBox::s_SelectionStartOffset = local_90;
        }
        fVar11 = extraout_XMM0_Da;
        uVar6 = uVar5;
      } while (iVar8 < pLineInput->m_NumChars);
    }
    bVar7 = 0;
    uVar6 = local_90;
  }
  else {
    if ((byte)((byte)this->m_MouseButtons & (bVar1 ^ 1U)) == 0) {
      DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll = '\0'
      ;
      DoEditBox::s_SelectionStartOffset = -1;
      bVar7 = 0;
      goto LAB_0018b363;
    }
    uVar6 = local_90;
    if (DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll ==
        '\x01') {
      fVar11 = this->m_MouseX;
      in_XMM1_Db.w = 0.0;
      if ((local_48.z <= fVar11) || (DoEditBox::s_ScrollStartX - fVar11 <= 10.0)) {
        in_XMM1_Da.z = local_48.z + local_40.z;
        if ((fVar11 <= in_XMM1_Da.z) || (fVar11 - DoEditBox::s_ScrollStartX <= 10.0))
        goto LAB_0018b300;
        uVar6 = str_utf8_forward(str,local_90);
      }
      else {
        in_XMM1_Da = local_48;
        uVar6 = str_utf8_rewind(str,local_90);
      }
      DoEditBox::s_ScrollStartX = this->m_MouseX;
      bVar7 = 1;
    }
    else if (bVar4) {
      bVar7 = 0;
    }
    else {
      DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll = '\0'
      ;
      DoEditBox::s_SelectionStartOffset = -1;
      this->m_ActiveItemValid = true;
      this->m_pActiveItem = (void *)0x0;
      this->m_pLastActiveItem = (void *)0x0;
LAB_0018b300:
      bVar7 = 0;
    }
  }
LAB_0018b30a:
  if (-1 < DoEditBox::s_SelectionStartOffset) {
LAB_0018b312:
    iVar8 = CLineInput::OffsetFromDisplayToActual(pLineInput,uVar6);
    CLineInput::SetCursorOffset(pLineInput,iVar8);
    iVar8 = CLineInput::OffsetFromDisplayToActual(pLineInput,DoEditBox::s_SelectionStartOffset);
    End = CLineInput::OffsetFromDisplayToActual(pLineInput,uVar6);
    CLineInput::SetSelection(pLineInput,iVar8,End);
  }
LAB_0018b363:
  if ((CLineInput *)this->m_pActiveItem == pLineInput) {
    this->m_ActiveItemValid = true;
    if ((this->m_MouseButtons & 1) == 0) {
      DoEditBox(CLineInput*,CUIRect_const*,float,int,IButtonColorFunction_const*)::s_DoScroll = '\0'
      ;
      DoEditBox::s_SelectionStartOffset = -1;
      this->m_pActiveItem = (void *)0x0;
    }
  }
  else if (((CLineInput *)this->m_pHotItem == pLineInput) && ((this->m_MouseButtons & 1) != 0)) {
    this->m_ActiveItemValid = true;
    this->m_pActiveItem = pLineInput;
    if (pLineInput != (CLineInput *)0x0) {
      this->m_pLastActiveItem = pLineInput;
    }
  }
  if (bVar4) {
    this->m_pBecommingHotItem = pLineInput;
  }
  if ((bVar7 | bVar1) == 1 && pCVar2 == pLineInput) {
    pIVar3 = this->m_pTextRender;
    uVar6 = CLineInput::OffsetFromActualToDisplay(pLineInput,pLineInput->m_CursorPos);
    (*(pIVar3->super_IInterface)._vptr_IInterface[6])(FontSize,pIVar3,str,(ulong)uVar6);
    in_XMM1_Da.z = extraout_XMM0_Da_00 - aVar12.z;
    if (in_XMM1_Da.z <= local_40.z) {
      in_XMM1_Db = extraout_XMM0_Db_00;
      if (in_XMM1_Da.z < 0.0) {
        do {
          aVar10.z = aVar12.z - local_40.z / 3.0;
          aVar12.z = 0.0;
          if (0.0 <= aVar10.z) {
            aVar12.z = aVar10.z;
          }
          in_XMM1_Db.w = 0.0;
          in_XMM1_Da = aVar12;
        } while (extraout_XMM0_Da_00 < aVar12.z);
      }
    }
    else {
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
                (FontSize,this->m_pTextRender,str,0xffffffff);
      in_XMM1_Db.w = 0.0;
      do {
        fVar11 = (extraout_XMM0_Da_01 - aVar12.z) - local_40.z;
        if (local_40.z / 3.0 <= fVar11) {
          fVar11 = local_40.z / 3.0;
        }
        aVar12.z = aVar12.z + fVar11;
        in_XMM1_Da = local_40;
      } while (local_40.z < extraout_XMM0_Da_00 - aVar12.z);
    }
  }
  pLineInput->m_ScrollOffset = (float)aVar12;
  if ((pCVar2 == pLineInput) && (this->m_Enabled != false)) {
    CLineInput::Activate(pLineInput,UI);
  }
  else {
    CLineInput::Deactivate(pLineInput);
  }
  local_58._0_8_ =
       (*(code *)**(undefined8 **)pColorFunction)(pColorFunction,pCVar2 == pLineInput,bVar4);
  local_58.field_2 = in_XMM1_Da;
  local_58.field_3 = in_XMM1_Db;
  CUIRect::Draw(pRect,&local_58,5.0,Corners);
  ClipEnable(this,pRect);
  local_48.z = local_48.z - aVar12.z;
  (pLineInput->m_TextCursor).m_CursorPos.field_0.x = (float)local_48;
  (pLineInput->m_TextCursor).m_CursorPos.field_1.y = local_3c * 0.5 + local_44;
  CLineInput::Render(pLineInput);
  ClipDisable(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool CUI::DoEditBox(CLineInput *pLineInput, const CUIRect *pRect, float FontSize, int Corners, const IButtonColorFunction *pColorFunction)
{
	CTextCursor *pCursor = pLineInput->GetCursor();
	pCursor->m_FontSize = FontSize;
	pCursor->m_Align = TEXTALIGN_ML;

	const bool Inside = MouseHovered(pRect);
	const bool Active = LastActiveItem() == pLineInput;
	const bool Changed = pLineInput->WasChanged();
	const char *pDisplayStr = pLineInput->GetDisplayedString();

	bool UpdateOffset = false;
	float ScrollOffset = pLineInput->GetScrollOffset();

	static bool s_DoScroll = false;
	static int s_SelectionStartOffset = -1;

	const float VSpacing = 2.0f;
	CUIRect Textbox;
	pRect->VMargin(VSpacing, &Textbox);

	if(Active)
	{
		static float s_ScrollStartX = 0.0f;

		int CursorOffset = pLineInput->GetCursorOffset();

		if(Inside && MouseButton(0) && !Changed)
		{
			s_DoScroll = true;
			s_ScrollStartX = MouseX();
			const float MxRel = MouseX() - Textbox.x;
			float PreviousWidth = 0.0f;
			for(int i = 1, Offset = 0; i <= pLineInput->GetNumChars(); i++)
			{
				int PrevOffset = Offset;
				Offset = str_utf8_forward(pDisplayStr, Offset);
				const float TextWidth = TextRender()->TextWidth(FontSize, pDisplayStr, Offset);
				if(PreviousWidth + (TextWidth - PreviousWidth)/2.0f - ScrollOffset > MxRel)
				{
					CursorOffset = PrevOffset;
					if(s_SelectionStartOffset < 0)
						s_SelectionStartOffset = CursorOffset;
					break;
				}
				PreviousWidth = TextWidth;

				if(i == pLineInput->GetNumChars())
				{
					CursorOffset = pLineInput->GetLength();
					if(s_SelectionStartOffset < 0)
						s_SelectionStartOffset = CursorOffset;
				}
			}
		}
		else if(!MouseButton(0) || Changed)
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
		}
		else if(s_DoScroll)
		{
			// do scrolling
			if(MouseX() < Textbox.x && s_ScrollStartX-MouseX() > 10.0f)
			{
				CursorOffset = str_utf8_rewind(pDisplayStr, CursorOffset);
				s_ScrollStartX = MouseX();
				UpdateOffset = true;
			}
			else if(MouseX() > Textbox.x+Textbox.w && MouseX()-s_ScrollStartX > 10.0f)
			{
				CursorOffset = str_utf8_forward(pDisplayStr, CursorOffset);
				s_ScrollStartX = MouseX();
				UpdateOffset = true;
			}
		}
		else if(!Inside && MouseButton(0))
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
			SetActiveItem(0);
			ClearLastActiveItem();
		}

		if(s_SelectionStartOffset >= 0)
		{
			pLineInput->SetCursorOffset(pLineInput->OffsetFromDisplayToActual(CursorOffset));
			pLineInput->SetSelection(pLineInput->OffsetFromDisplayToActual(s_SelectionStartOffset), pLineInput->OffsetFromDisplayToActual(CursorOffset));
		}
	}

	bool JustGotActive = false;

	if(CheckActiveItem(pLineInput))
	{
		if(!MouseButton(0))
		{
			s_DoScroll = false;
			s_SelectionStartOffset = -1;
			SetActiveItem(0);
		}
	}
	else if(HotItem() == pLineInput)
	{
		if(MouseButton(0))
		{
			if(!Active)
				JustGotActive = true;
			SetActiveItem(pLineInput);
		}
	}

	if(Inside)
		SetHotItem(pLineInput);

	// check if the text has to be moved
	if(Active && !JustGotActive && (UpdateOffset || Changed))
	{
		float w = TextRender()->TextWidth(FontSize, pDisplayStr, pLineInput->OffsetFromActualToDisplay(pLineInput->GetCursorOffset()));
		if(w-ScrollOffset > Textbox.w)
		{
			// move to the left
			float wt = TextRender()->TextWidth(FontSize, pDisplayStr, -1);
			do
			{
				ScrollOffset += minimum(wt-ScrollOffset-Textbox.w, Textbox.w/3);
			}
			while(w-ScrollOffset > Textbox.w);
		}
		else if(w-ScrollOffset < 0.0f)
		{
			// move to the right
			do
			{
				ScrollOffset = maximum(0.0f, ScrollOffset-Textbox.w/3);
			}
			while(w-ScrollOffset < 0.0f);
		}
	}

	pLineInput->SetScrollOffset(ScrollOffset);
	if(Enabled() && Active && !JustGotActive)
		pLineInput->Activate(UI);
	else
		pLineInput->Deactivate();

	// render
	pRect->Draw(pColorFunction->GetColor(Active, Inside), 5.0f, Corners);
	ClipEnable(pRect);
	Textbox.x -= ScrollOffset;
	pCursor->MoveTo(Textbox.x, Textbox.y + Textbox.h/2.0f);
	pLineInput->Render();
	ClipDisable();

	return Changed;
}